

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__hdr_to_ldr(float *data,int x,int y,int comp)

{
  undefined1 auVar1 [16];
  uint uVar2;
  stbi_uc *psVar3;
  long lVar4;
  ulong uVar5;
  stbi_uc *psVar6;
  float *pfVar7;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 extraout_var [60];
  
  if (data != (float *)0x0) {
    psVar3 = (stbi_uc *)stbi__malloc_mad3(x,y,comp,0);
    if (psVar3 != (stbi_uc *)0x0) {
      if (0 < y * x) {
        uVar2 = comp + -1 + (comp & 1U);
        lVar8 = (long)comp;
        uVar9 = 0;
        auVar11 = ZEXT1664(ZEXT816(0) << 0x40);
        psVar6 = psVar3;
        pfVar7 = data;
        do {
          uVar5 = 0;
          if (0 < (int)uVar2) {
            uVar5 = 0;
            do {
              auVar10._0_4_ = powf(pfVar7[uVar5] * stbi__h2l_scale_i,stbi__h2l_gamma_i);
              auVar10._4_60_ = extraout_var;
              auVar11 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar1 = vfmadd213ss_fma(auVar10._0_16_,SUB6416(ZEXT464(0x437f0000),0),
                                       SUB6416(ZEXT464(0x3f000000),0));
              auVar1 = vmaxss_avx(ZEXT816(0) << 0x40,auVar1);
              auVar1 = vminss_avx(SUB6416(ZEXT464(0x437f0000),0),auVar1);
              psVar6[uVar5] = (stbi_uc)(int)auVar1._0_4_;
              uVar5 = uVar5 + 1;
            } while (uVar2 != uVar5);
          }
          if ((int)uVar5 < comp) {
            lVar4 = (long)(int)uVar5 + uVar9 * lVar8;
            auVar1 = vfmadd132ss_fma(ZEXT416((uint)data[lVar4]),SUB6416(ZEXT464(0x3f000000),0),
                                     SUB6416(ZEXT464(0x437f0000),0));
            auVar1 = vmaxss_avx(auVar11._0_16_,auVar1);
            auVar1 = vminss_avx(SUB6416(ZEXT464(0x437f0000),0),auVar1);
            psVar3[lVar4] = (stbi_uc)(int)auVar1._0_4_;
          }
          uVar9 = uVar9 + 1;
          pfVar7 = pfVar7 + lVar8;
          psVar6 = psVar6 + lVar8;
        } while (uVar9 != (uint)(y * x));
      }
      free(data);
      return psVar3;
    }
    free(data);
    stbi__g_failure_reason = "outofmem";
  }
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__hdr_to_ldr(float   *data, int x, int y, int comp)
{
   int i,k,n;
   stbi_uc *output;
   if (!data) return NULL;
   output = (stbi_uc *) stbi__malloc_mad3(x, y, comp, 0);
   if (output == NULL) { STBI_FREE(data); return stbi__errpuc("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         float z = (float) pow(data[i*comp+k]*stbi__h2l_scale_i, stbi__h2l_gamma_i) * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
      if (k < comp) {
         float z = data[i*comp+k] * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
   }
   STBI_FREE(data);
   return output;
}